

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

void __thiscall
snappy::SnappyDecompressor::
DecompressAllTags<snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>>
          (SnappyDecompressor *this,SnappyScatteredWriter<snappy::SnappySinkAllocator> *writer)

{
  byte bVar1;
  ushort uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ulong in_RAX;
  undefined4 extraout_var;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  uint *puVar14;
  byte *pbVar15;
  size_t n;
  ulong local_38;
  uint *ip;
  
  pbVar15 = (byte *)this->ip_;
  local_38 = in_RAX;
  if ((long)this->ip_limit_ - (long)pbVar15 < 5) {
    bVar4 = RefillTag(this);
    if (!bVar4) {
      return;
    }
    pbVar15 = (byte *)this->ip_;
  }
LAB_0015141c:
  do {
    ip = (uint *)(pbVar15 + 1);
    bVar1 = *pbVar15;
    if ((bVar1 & 3) == 0) {
      uVar13 = (ulong)(bVar1 >> 2) + 1;
      uVar7 = (long)this->ip_limit_ - (long)ip;
      pcVar12 = writer->op_ptr_;
      uVar9 = (long)writer->op_limit_ - (long)pcVar12;
      if (((bVar1 < 0x40) && (0x14 < uVar7)) && (0xf < (int)uVar9)) {
        *(undefined8 *)pcVar12 = *(undefined8 *)(pbVar15 + 1);
        *(undefined8 *)(pcVar12 + 8) = *(undefined8 *)(pbVar15 + 9);
        writer->op_ptr_ = pcVar12 + uVar13;
        pbVar15 = (byte *)((long)ip + uVar13);
        goto LAB_0015141c;
      }
      if (0xec < bVar1) {
        puVar14 = (uint *)((long)ip + ((ulong)(bVar1 >> 2) - 0x3b));
        uVar13 = (ulong)((*(uint *)(char_table + uVar13 * 4 + 0x110) & *ip) + 1);
        uVar7 = (long)this->ip_limit_ - (long)puVar14;
        ip = puVar14;
      }
      if (uVar7 < uVar13) {
        do {
          if ((ulong)((long)writer->op_limit_ - (long)writer->op_ptr_) < uVar7) {
            bVar4 = SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
                              (writer,(char *)ip,uVar7);
            if (!bVar4) {
              return;
            }
          }
          else {
            memcpy(writer->op_ptr_,ip,uVar7);
            writer->op_ptr_ = writer->op_ptr_ + uVar7;
          }
          (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
          iVar5 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
          ip = (uint *)CONCAT44(extraout_var,iVar5);
          this->peeked_ = (uint32)local_38;
          if (local_38 == 0) {
            return;
          }
          uVar13 = uVar13 - uVar7;
          this->ip_limit_ = (char *)((long)ip + local_38);
          uVar7 = local_38;
        } while (local_38 < uVar13);
        pcVar12 = writer->op_ptr_;
        uVar9 = (long)writer->op_limit_ - (long)pcVar12;
      }
      if (uVar9 < uVar13) {
        bVar4 = SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppend
                          (writer,(char *)ip,uVar13);
        if (!bVar4) {
          return;
        }
      }
      else {
        memcpy(pcVar12,ip,uVar13);
        writer->op_ptr_ = writer->op_ptr_ + uVar13;
      }
      pbVar15 = (byte *)((long)ip + uVar13);
      if (4 < (long)this->ip_limit_ - (long)pbVar15) goto LAB_0015141c;
      this->ip_ = (char *)pbVar15;
    }
    else {
      uVar2 = *(ushort *)(char_table + (ulong)bVar1 * 2);
      uVar7 = (ulong)uVar2 & 0xff;
      uVar8 = (uVar2 & 0x700) + (*(uint *)(wordmask + (ulong)(uVar2 >> 0xb) * 4) & *ip);
      uVar9 = (ulong)uVar8;
      pcVar12 = writer->op_ptr_;
      if ((uVar9 - 1 < (ulong)((long)pcVar12 - (long)writer->op_base_)) &&
         (uVar7 + 10 <= (ulong)((long)writer->op_limit_ - (long)pcVar12))) {
        pcVar6 = pcVar12 + -uVar9;
        pcVar11 = pcVar12;
        uVar13 = uVar7;
        if (uVar8 < 8) {
          uVar3 = *(undefined8 *)pcVar6;
          do {
            *(undefined8 *)pcVar11 = uVar3;
            uVar13 = uVar13 - uVar9;
            pcVar11 = pcVar11 + uVar9;
            uVar9 = (long)pcVar11 - (long)pcVar6;
          } while ((long)uVar9 < 8);
        }
        if (0 < (long)uVar13) {
          uVar13 = uVar13 + 8;
          lVar10 = 0;
          do {
            *(undefined8 *)(pcVar11 + lVar10) = *(undefined8 *)(pcVar6 + lVar10);
            uVar13 = uVar13 - 8;
            lVar10 = lVar10 + 8;
          } while (8 < uVar13);
        }
        writer->op_ptr_ = pcVar12 + uVar7;
      }
      else {
        bVar4 = SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppendFromSelf
                          (writer,uVar9,uVar7);
        if (!bVar4) {
          return;
        }
      }
      pbVar15 = (byte *)((long)ip + (ulong)(uVar2 >> 0xb));
      if (4 < (long)this->ip_limit_ - (long)pbVar15) goto LAB_0015141c;
      this->ip_ = (char *)pbVar15;
    }
    bVar4 = RefillTag(this);
    pbVar15 = (byte *)this->ip_;
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }